

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O2

bool anon_unknown.dwarf_5e825e::TraceOutputFormatHelper
               (optional<cmTraceEnums::TraceOutputFormat> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  _Optional_payload_base<cmTraceEnums::TraceOutputFormat> _Var2;
  String SStack_48;
  
  if (value == (Value *)0x0) {
    if ((out->super__Optional_base<cmTraceEnums::TraceOutputFormat,_true,_true>)._M_payload.
        super__Optional_payload_base<cmTraceEnums::TraceOutputFormat>._M_engaged != true) {
      return true;
    }
    (out->super__Optional_base<cmTraceEnums::TraceOutputFormat,_true,_true>)._M_payload.
    super__Optional_payload_base<cmTraceEnums::TraceOutputFormat>._M_engaged = false;
    return true;
  }
  bVar1 = Json::Value::isString(value);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&SStack_48,value);
    bVar1 = std::operator==(&SStack_48,"human");
    std::__cxx11::string::~string((string *)&SStack_48);
    if (bVar1) {
      _Var2._M_payload = (_Storage<cmTraceEnums::TraceOutputFormat,_true>)0x1;
      _Var2._M_engaged = true;
      _Var2._5_3_ = 0;
    }
    else {
      Json::Value::asString_abi_cxx11_(&SStack_48,value);
      bVar1 = std::operator==(&SStack_48,"json-v1");
      std::__cxx11::string::~string((string *)&SStack_48);
      if (!bVar1) goto LAB_0023712d;
      _Var2._M_payload = (_Storage<cmTraceEnums::TraceOutputFormat,_true>)0x2;
      _Var2._M_engaged = true;
      _Var2._5_3_ = 0;
    }
    (out->super__Optional_base<cmTraceEnums::TraceOutputFormat,_true,_true>)._M_payload.
    super__Optional_payload_base<cmTraceEnums::TraceOutputFormat> = _Var2;
    bVar1 = true;
  }
  else {
LAB_0023712d:
    cmCMakePresetsErrors::INVALID_PRESET(value,state);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TraceOutputFormatHelper(cm::optional<TraceOutputFormat>& out,
                             const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "human") {
    out = TraceOutputFormat::Human;
  } else if (value->asString() == "json-v1") {
    out = TraceOutputFormat::JSONv1;
  } else {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  return true;
}